

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceGetFabricVertexExp(ze_device_handle_t hDevice,ze_fabric_vertex_handle_t *phVertex)

{
  ze_fabric_vertex_handle_t p_Var1;
  ze_pfnDeviceGetFabricVertexExp_t pfnGetFabricVertexExp;
  ze_result_t result;
  ze_fabric_vertex_handle_t *phVertex_local;
  ze_device_handle_t hDevice_local;
  
  pfnGetFabricVertexExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c2c8 == (code *)0x0) {
    p_Var1 = (ze_fabric_vertex_handle_t)context_t::get((context_t *)&context);
    *phVertex = p_Var1;
  }
  else {
    pfnGetFabricVertexExp._4_4_ = (*DAT_0011c2c8)(hDevice,phVertex);
  }
  return pfnGetFabricVertexExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetFabricVertexExp(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_fabric_vertex_handle_t* phVertex             ///< [out] fabric vertex handle corresponding to device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetFabricVertexExp = context.zeDdiTable.DeviceExp.pfnGetFabricVertexExp;
        if( nullptr != pfnGetFabricVertexExp )
        {
            result = pfnGetFabricVertexExp( hDevice, phVertex );
        }
        else
        {
            // generic implementation
            *phVertex = reinterpret_cast<ze_fabric_vertex_handle_t>( context.get() );

        }

        return result;
    }